

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void tc_uECC_vli_mmod(tc_uECC_word_t *result,tc_uECC_word_t *product,tc_uECC_word_t *mod,
                     wordcount_t num_words)

{
  tc_uECC_word_t *ptVar1;
  byte bVar2;
  bitcount_t bVar3;
  int iVar4;
  undefined6 extraout_var;
  uint uVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  tc_uECC_word_t *ptVar7;
  ulong uVar8;
  uint uVar9;
  tc_uECC_word_t *ptVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  char cVar15;
  tc_uECC_word_t tmp [16];
  tc_uECC_word_t mod_multiple [16];
  tc_uECC_word_t *v [2];
  
  v[0] = product;
  bVar3 = tc_uECC_vli_numBits(mod,num_words);
  iVar12 = (int)CONCAT71(in_register_00000009,num_words);
  iVar13 = iVar12 * 0x40 - (int)CONCAT62(extraout_var,bVar3);
  iVar4 = iVar13 + 0x1f;
  if (-1 < (short)iVar13) {
    iVar4 = iVar13;
  }
  uVar5 = (uint)(int)(short)iVar4 >> 5;
  cVar15 = (char)uVar5;
  if ('\0' < cVar15) {
    memset(tmp + 0xe,0,(ulong)((uVar5 & 0x7f) << 2));
  }
  if ((short)(iVar13 % 0x20) < 1) {
    if ('\0' < num_words) {
      memcpy(tmp + (long)cVar15 + 0xe,mod,(ulong)(byte)num_words << 2);
    }
  }
  else if (num_words != '\0') {
    bVar2 = (byte)(iVar13 % 0x20);
    uVar8 = 0;
    uVar5 = 0;
    do {
      uVar9 = mod[uVar8] << (bVar2 & 0x1f) | uVar5;
      uVar5 = mod[uVar8] >> (0x20 - bVar2 & 0x1f);
      tmp[(ulong)(uint)((int)cVar15 + (int)uVar8) + 0xe] = uVar9;
      uVar8 = uVar8 + 1;
    } while ((CONCAT71(in_register_00000009,num_words) & 0xffffffff) != uVar8);
  }
  if ((short)iVar13 < 0) {
    uVar8 = 1;
  }
  else {
    ptVar7 = tmp + (long)num_words + 0xe;
    uVar8 = 1;
    do {
      uVar5 = (uint)uVar8;
      if (num_words < '\x01') {
        uVar8 = (ulong)(uVar5 == 0);
LAB_0011ac85:
        tmp[(long)(iVar12 + -1) + 0xe] = tmp[(long)(iVar12 + -1) + 0xe] | *ptVar7 << 0x1f;
      }
      else {
        ptVar10 = v[uVar8 - 1];
        ptVar1 = v[(ulong)(uVar5 ^ 1) - 1];
        cVar15 = '\0';
        uVar9 = 0;
        do {
          uVar6 = tmp[(long)cVar15 + 0xe] + uVar9;
          uVar14 = (uint)(ptVar10[cVar15] < uVar6);
          if (uVar6 == 0) {
            uVar14 = uVar9;
          }
          ptVar1[cVar15] = ptVar10[cVar15] - uVar6;
          cVar15 = cVar15 + '\x01';
          uVar9 = uVar14;
        } while ((int)cVar15 < iVar12 * 2);
        uVar8 = (ulong)(uVar5 == uVar14);
        if (num_words < '\x01') goto LAB_0011ac85;
        uVar5 = 0;
        ptVar10 = tmp + (ulong)(byte)num_words + 0xe;
        do {
          uVar9 = ptVar10[-1];
          ptVar10[-1] = uVar9 >> 1 | uVar5;
          ptVar10 = ptVar10 + -1;
          uVar5 = uVar9 << 0x1f;
        } while (tmp + 0xe < ptVar10);
        tmp[(long)(iVar12 + -1) + 0xe] = tmp[(long)(iVar12 + -1) + 0xe] | *ptVar7 << 0x1f;
        uVar5 = 0;
        ptVar10 = ptVar7 + (byte)num_words;
        do {
          uVar9 = ptVar10[-1];
          ptVar10[-1] = uVar9 >> 1 | uVar5;
          ptVar10 = ptVar10 + -1;
          uVar5 = uVar9 << 0x1f;
        } while (ptVar7 < ptVar10);
      }
      sVar11 = (short)iVar13;
      iVar13 = iVar13 + -1;
    } while (0 < sVar11);
  }
  if ('\0' < num_words) {
    ptVar7 = v[uVar8 - 1];
    uVar8 = 0;
    do {
      result[uVar8] = ptVar7[uVar8];
      uVar8 = uVar8 + 1;
    } while ((byte)num_words != uVar8);
  }
  return;
}

Assistant:

void tc_uECC_vli_mmod(tc_uECC_word_t *result, tc_uECC_word_t *product,
    		   const tc_uECC_word_t *mod, wordcount_t num_words)
{
	tc_uECC_word_t mod_multiple[2 * NUM_ECC_WORDS];
	tc_uECC_word_t tmp[2 * NUM_ECC_WORDS];
	tc_uECC_word_t *v[2] = {tmp, product};
	tc_uECC_word_t index;

	/* Shift mod so its highest set bit is at the maximum position. */
	bitcount_t shift = (num_words * 2 * tc_uECC_WORD_BITS) -
			   tc_uECC_vli_numBits(mod, num_words);
	wordcount_t word_shift = shift / tc_uECC_WORD_BITS;
	wordcount_t bit_shift = shift % tc_uECC_WORD_BITS;
	tc_uECC_word_t carry = 0;
	tc_uECC_vli_clear(mod_multiple, word_shift);
	if (bit_shift > 0) {
		for(index = 0; index < (tc_uECC_word_t)num_words; ++index) {
			mod_multiple[word_shift + index] = (mod[index] << bit_shift) | carry;
			carry = mod[index] >> (tc_uECC_WORD_BITS - bit_shift);
		}
	} else {
		tc_uECC_vli_set(mod_multiple + word_shift, mod, num_words);
	}

	for (index = 1; shift >= 0; --shift) {
		tc_uECC_word_t borrow = 0;
		wordcount_t i;
		for (i = 0; i < num_words * 2; ++i) {
			tc_uECC_word_t diff = v[index][i] - mod_multiple[i] - borrow;
			if (diff != v[index][i]) {
				borrow = (diff > v[index][i]);
			}
			v[1 - index][i] = diff;
		}
		/* Swap the index if there was no borrow */
		index = !(index ^ borrow);
		tc_uECC_vli_rshift1(mod_multiple, num_words);
		mod_multiple[num_words - 1] |= mod_multiple[num_words] <<
					       (tc_uECC_WORD_BITS - 1);
		tc_uECC_vli_rshift1(mod_multiple + num_words, num_words);
	}
	tc_uECC_vli_set(result, v[index], num_words);
}